

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O2

string * __thiscall
duckdb::DialectCandidates::Print_abi_cxx11_(string *__return_storage_ptr__,DialectCandidates *this)

{
  vector<char,_true> *this_00;
  ostream *poVar1;
  reference pvVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  reference pvVar4;
  idx_t i;
  ulong __n;
  idx_t j;
  pointer pcVar5;
  idx_t k;
  pointer __n_00;
  mapped_type escape_candidate;
  mapped_type quote_candidate;
  ostringstream search_space;
  byte local_1f9;
  DialectCandidates *local_1f8;
  string *local_1f0;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1e8;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1e0;
  _Vector_base<char,_std::allocator<char>_> local_1d8;
  _Vector_base<char,_std::allocator<char>_> local_1c0;
  ostringstream local_1a8 [376];
  
  local_1f8 = this;
  local_1f0 = __return_storage_ptr__;
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::operator<<((ostream *)local_1a8,"Delimiter Candidates: ");
  for (__n = 0; __n < (ulong)((long)(local_1f8->delim_candidates).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_1f8->delim_candidates).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    poVar1 = ::std::operator<<((ostream *)local_1a8,"\'");
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&local_1f8->delim_candidates,__n);
    poVar1 = ::std::operator<<(poVar1,(string *)pvVar2);
    ::std::operator<<(poVar1,"\'");
    if (__n < ((long)(local_1f8->delim_candidates).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_1f8->delim_candidates).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      ::std::operator<<((ostream *)local_1a8,", ");
    }
  }
  ::std::operator<<((ostream *)local_1a8,anon_var_dwarf_3b2a754 + 8);
  ::std::operator<<((ostream *)local_1a8,"Quote/Escape Candidates: ");
  local_1e0 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&local_1f8->quote_candidates_map;
  local_1e8 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&local_1f8->escape_candidates_map;
  local_1f9 = 0;
  while( true ) {
    if ((*(int *)&(local_1f8->quote_rule_candidates).
                  super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                  super__Vector_impl_data._M_finish -
         *(int *)&(local_1f8->quote_rule_candidates).
                  super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                  super__Vector_impl_data._M_start & 0xffU) <= (uint)local_1f9) break;
    pvVar3 = &::std::__detail::
              _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_1e0,&local_1f9)->super_vector<char,_std::allocator<char>_>;
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_1c0,pvVar3);
    pvVar3 = &::std::__detail::
              _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_1e8,&local_1f9)->super_vector<char,_std::allocator<char>_>;
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_1d8,pvVar3);
    for (pcVar5 = (pointer)0x0;
        pcVar5 < local_1c0._M_impl.super__Vector_impl_data._M_finish +
                 -(long)local_1c0._M_impl.super__Vector_impl_data._M_start; pcVar5 = pcVar5 + 1) {
      for (__n_00 = (pointer)0x0;
          __n_00 < local_1d8._M_impl.super__Vector_impl_data._M_finish +
                   -(long)local_1d8._M_impl.super__Vector_impl_data._M_start; __n_00 = __n_00 + 1) {
        ::std::operator<<((ostream *)local_1a8,"[\'");
        pvVar4 = vector<char,_true>::get<true>((vector<char,_true> *)&local_1c0,(size_type)pcVar5);
        if (*pvVar4 == '\0') {
          ::std::operator<<((ostream *)local_1a8,"(no quote)");
        }
        else {
          pvVar4 = vector<char,_true>::get<true>((vector<char,_true> *)&local_1c0,(size_type)pcVar5)
          ;
          ::std::operator<<((ostream *)local_1a8,*pvVar4);
        }
        ::std::operator<<((ostream *)local_1a8,"\',\'");
        pvVar4 = vector<char,_true>::get<true>((vector<char,_true> *)&local_1d8,(size_type)__n_00);
        if (*pvVar4 == '\0') {
          ::std::operator<<((ostream *)local_1a8,"(no escape)");
        }
        else {
          pvVar4 = vector<char,_true>::get<true>((vector<char,_true> *)&local_1d8,(size_type)__n_00)
          ;
          ::std::operator<<((ostream *)local_1a8,*pvVar4);
        }
        ::std::operator<<((ostream *)local_1a8,"\']");
        if (__n_00 < local_1d8._M_impl.super__Vector_impl_data._M_finish +
                     ~(ulong)local_1d8._M_impl.super__Vector_impl_data._M_start) {
          ::std::operator<<((ostream *)local_1a8,",");
        }
      }
      if (pcVar5 < local_1c0._M_impl.super__Vector_impl_data._M_finish +
                   ~(ulong)local_1c0._M_impl.super__Vector_impl_data._M_start) {
        ::std::operator<<((ostream *)local_1a8,",");
      }
    }
    if ((pointer)(ulong)local_1f9 <
        (local_1f8->quote_rule_candidates).
        super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
        super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
        super__Vector_impl_data._M_finish +
        ~(ulong)(local_1f8->quote_rule_candidates).
                super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                super__Vector_impl_data._M_start) {
      ::std::operator<<((ostream *)local_1a8,",");
    }
    ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1d8);
    ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1c0);
    local_1f9 = local_1f9 + 1;
  }
  ::std::operator<<((ostream *)local_1a8,anon_var_dwarf_3b2a754 + 8);
  ::std::operator<<((ostream *)local_1a8,"Comment Candidates: ");
  this_00 = &local_1f8->comment_candidates;
  for (pcVar5 = (pointer)0x0;
      pcVar5 < (local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish +
               -(long)(local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start; pcVar5 = pcVar5 + 1) {
    poVar1 = ::std::operator<<((ostream *)local_1a8,"\'");
    pvVar4 = vector<char,_true>::get<true>(this_00,(size_type)pcVar5);
    poVar1 = ::std::operator<<(poVar1,*pvVar4);
    ::std::operator<<(poVar1,"\'");
    if (pcVar5 < (local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish +
                 ~(ulong)(local_1f8->comment_candidates).super_vector<char,_std::allocator<char>_>.
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start) {
      ::std::operator<<((ostream *)local_1a8,", ");
    }
  }
  ::std::operator<<((ostream *)local_1a8,anon_var_dwarf_3b2a754 + 8);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return local_1f0;
}

Assistant:

string DialectCandidates::Print() {
	std::ostringstream search_space;

	search_space << "Delimiter Candidates: ";
	for (idx_t i = 0; i < delim_candidates.size(); i++) {
		search_space << "\'" << delim_candidates[i] << "\'";
		if (i < delim_candidates.size() - 1) {
			search_space << ", ";
		}
	}
	search_space << "\n";
	search_space << "Quote/Escape Candidates: ";
	for (uint8_t i = 0; i < static_cast<uint8_t>(quote_rule_candidates.size()); i++) {
		auto quote_candidate = quote_candidates_map[i];
		auto escape_candidate = escape_candidates_map[i];
		for (idx_t j = 0; j < quote_candidate.size(); j++) {
			for (idx_t k = 0; k < escape_candidate.size(); k++) {
				search_space << "[\'";
				if (quote_candidate[j] == '\0') {
					search_space << "(no quote)";
				} else {
					search_space << quote_candidate[j];
				}
				search_space << "\',\'";
				if (escape_candidate[k] == '\0') {
					search_space << "(no escape)";
				} else {
					search_space << escape_candidate[k];
				}
				search_space << "\']";
				if (k < escape_candidate.size() - 1) {
					search_space << ",";
				}
			}
			if (j < quote_candidate.size() - 1) {
				search_space << ",";
			}
		}
		if (i < quote_rule_candidates.size() - 1) {
			search_space << ",";
		}
	}
	search_space << "\n";

	search_space << "Comment Candidates: ";
	for (idx_t i = 0; i < comment_candidates.size(); i++) {
		search_space << "\'" << comment_candidates[i] << "\'";
		if (i < comment_candidates.size() - 1) {
			search_space << ", ";
		}
	}
	search_space << "\n";

	return search_space.str();
}